

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  int *piVar1;
  cmCTest *pcVar2;
  pointer piVar3;
  iterator __position;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ostream *poVar11;
  char *__s;
  size_t sVar12;
  long *plVar13;
  pointer pbVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  mapped_type *this_00;
  long lVar16;
  ulong uVar17;
  string *t;
  pointer pbVar18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  int retVal;
  string lcovFile;
  string nl;
  string lineNumber;
  string output;
  string actualSourceFile;
  string errors;
  string srcname;
  string daGlob;
  string fileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string dir;
  string sourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string st2lcovOutputRex3;
  ostringstream cmCTestLog_msg_15;
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string command;
  string lcovCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  covargs;
  string lcovExtraFlags;
  ostringstream cmCTestLog_msg_21;
  string testingDir;
  cmWorkingDirectory workdir;
  cmCTestCoverageHandlerLocale locale_C;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  Glob gl;
  RegularExpression st2re3;
  int local_a20;
  int local_a1c;
  int local_a0c;
  string *local_a08;
  char *local_a00;
  long local_9f8;
  char local_9f0;
  undefined7 uStack_9ef;
  string local_9e0;
  long *local_9c0 [2];
  long local_9b0 [2];
  string local_9a0;
  key_type local_980;
  int local_95c;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d8;
  char *local_8b8;
  pointer local_8b0;
  char local_8a8;
  undefined7 uStack_8a7;
  char *local_898;
  long local_890;
  char local_888;
  undefined7 uStack_887;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_878;
  long *local_858 [2];
  long local_848 [2];
  string local_838;
  byte abStack_818 [80];
  ios_base local_7c8 [408];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  byte abStack_610 [80];
  ios_base local_5c0 [408];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  string local_408;
  string local_3e8;
  string *local_3c8;
  pointer local_3c0;
  pointer local_3b8;
  TotalCoverageMap *local_3b0;
  pointer local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  string local_388;
  undefined1 local_368 [16];
  _func_int *local_358 [12];
  ios_base local_2f8 [264];
  string local_1f0;
  cmWorkingDirectory local_1d0;
  cmCTestCoverageHandlerLocale local_1a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  Glob local_158;
  RegularExpression local_100;
  
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_630._0_8_ = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_630,"CoverageCommand","");
  cmCTest::GetCTestConfiguration(&local_3e8,pcVar2,(string *)local_630);
  if ((undefined1 *)local_630._0_8_ != local_620) {
    operator_delete((void *)local_630._0_8_,local_620._0_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_630._0_8_ = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_630,"CoverageExtraFlags","");
  cmCTest::GetCTestConfiguration(&local_388,pcVar2,(string *)local_630);
  if ((undefined1 *)local_630._0_8_ != local_620) {
    operator_delete((void *)local_630._0_8_,local_620._0_8_ + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_3e8);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_630," Not a valid Intel Coverage command.",0x24);
    std::ios::widen((char)(ostream *)local_630 + (char)*(undefined8 *)(local_630._0_8_ + -0x18));
    std::ostream::put((char)local_630);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x540,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
    std::ios_base::~ios_base(local_5c0);
    iVar8 = 0;
    goto LAB_001b12e4;
  }
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"[0-9]+%","");
  plVar13 = local_858[0];
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  if (plVar13 != (long *)0x0) {
    cmsys::RegularExpression::compile(&local_100,(char *)plVar13);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_630," This is coverage command: ",0x1b);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_630,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x549,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
  std::ios_base::~ios_base(local_5c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_630," These are coverage command flags: ",0x23);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_630,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x54e,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
  std::ios_base::~ios_base(local_5c0);
  local_878.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_878.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_878.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = FindLCovFiles(this,&local_878);
  if (bVar5) {
    if (local_878.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_878.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_630," Cannot find any LCov coverage files.",0x25);
      std::ios::widen((char)(ostream *)local_630 + (char)*(undefined8 *)(local_630._0_8_ + -0x18));
      std::ostream::put((char)local_630);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x55a,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_001b11c3;
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_1f0,(this->super_cmCTestGenericHandler).CTest);
    local_188._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_188._M_impl.super__Rb_tree_header._M_header;
    local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
    local_980._M_string_length = 0;
    local_980.field_2._M_local_buf[0] = '\0';
    local_188._M_impl.super__Rb_tree_header._M_header._M_right =
         local_188._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_630,"   Processing coverage (each . represents one file):",0x34);
    std::ios::widen((char)(ostream *)local_630 + (char)*(undefined8 *)(local_630._0_8_ + -0x18));
    std::ostream::put((char)local_630);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x566,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
    std::ios_base::~ios_base(local_5c0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"    ",4);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x567,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
    std::ios_base::~ios_base(local_5c0);
    cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&local_1a8);
    cmSystemTools::ParseArguments(&local_3a0,&local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&local_3a0,
             (const_iterator)
             local_3a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_3e8);
    joinCommandLine(&local_408,&local_3a0);
    local_a08 = local_878.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_3c8 = local_878.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_878.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_878.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar8 = 0;
    }
    else {
      local_3b0 = &cont->TotalCoverage;
      local_a1c = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,".",1);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x577,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_838._M_dataplus._M_p != &local_838.field_2) {
          operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
        std::ios_base::~ios_base(local_5c0);
        cmsys::SystemTools::GetFilenamePath(&local_8f8,local_a08);
        cmWorkingDirectory::cmWorkingDirectory(&local_1d0,&local_8f8);
        if (local_1d0.ResultCode == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_630,"Current coverage dir: ",0x16);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_630,local_8f8._M_dataplus._M_p,
                               local_8f8._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x585,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_838._M_dataplus._M_p != &local_838.field_2) {
            operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
          std::ios_base::~ios_base(local_5c0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_630,local_408._M_dataplus._M_p,
                               local_408._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x587,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_838._M_dataplus._M_p != &local_838.field_2) {
            operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
          std::ios_base::~ios_base(local_5c0);
          local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
          local_9a0._M_string_length = 0;
          local_9a0.field_2._M_local_buf[0] = '\0';
          local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
          local_958._M_string_length = 0;
          local_958.field_2._M_local_buf[0] = '\0';
          local_a0c = 0;
          poVar11 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"* Run coverage for: ",0x14);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_8f8._M_dataplus._M_p,local_8f8._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          poVar11 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  Command: ",0xb);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_408._M_dataplus._M_p,local_408._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          bVar5 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,&local_3a0,
                                      &local_9a0,&local_958,&local_a0c,local_8f8._M_dataplus._M_p,
                                      (cmDuration)0x0,Auto);
          poVar11 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  Output: ",10);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_9a0._M_dataplus._M_p,local_9a0._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          poVar11 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  Errors: ",10);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_958._M_dataplus._M_p,local_958._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if (bVar5) {
            if (local_a0c != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_630,"Coverage command returned: ",0x1b);
              poVar11 = (ostream *)std::ostream::operator<<(local_630,local_a0c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," while processing: ",0x13)
              ;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(local_a08->_M_dataplus)._M_p,local_a08->_M_string_length
                                  );
              std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x59f,local_838._M_dataplus._M_p,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_838._M_dataplus._M_p != &local_838.field_2) {
                operator_delete(local_838._M_dataplus._M_p,
                                local_838.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
              std::ios_base::~ios_base(local_5c0);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_630,"Command produced error: ",0x18);
              plVar13 = (long *)std::ostream::operator<<(local_630,cont->Error);
              std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
              std::ostream::put((char)plVar13);
              std::ostream::flush();
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x5a1,local_838._M_dataplus._M_p,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_838._M_dataplus._M_p != &local_838.field_2) {
                operator_delete(local_838._M_dataplus._M_p,
                                local_838.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
              std::ios_base::~ios_base(local_5c0);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_630,
                       "--------------------------------------------------------------",0x3e);
            std::ios::widen((char)*(undefined8 *)(local_630._0_8_ + -0x18) + (char)local_630);
            std::ostream::put((char)local_630);
            poVar11 = (ostream *)std::ostream::flush();
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_9a0._M_dataplus._M_p,local_9a0._M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            poVar11 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"--------------------------------------------------------------",0x3e
                      );
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x5aa,local_838._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_838._M_dataplus._M_p != &local_838.field_2) {
              operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
            std::ios_base::~ios_base(local_5c0);
            local_428.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_428.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_428.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmsys::SystemTools::Split(&local_9a0,&local_428);
            local_3c0 = local_428.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            pbVar14 = local_428.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_428.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_428.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                local_898 = &local_888;
                local_890 = 0;
                local_888 = '\0';
                local_a00 = &local_9f0;
                local_9f8 = 0;
                local_9f0 = '\0';
                local_3b8 = pbVar14;
                cmsys::Glob::Glob(&local_158);
                local_158.Recurse = true;
                local_158.RecurseThroughSymlinks = false;
                local_8b8 = &local_8a8;
                local_8b0 = (pointer)0x0;
                local_8a8 = '\0';
                local_8d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_8d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_8d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                cmCTest::GetBinaryDir_abi_cxx11_
                          ((string *)local_630,(this->super_cmCTestGenericHandler).CTest);
                std::__cxx11::string::operator=((string *)&local_8b8,(string *)local_630);
                if ((undefined1 *)local_630._0_8_ != local_620) {
                  operator_delete((void *)local_630._0_8_,local_620._0_8_ + 1);
                }
                local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
                local_918._M_string_length = 0;
                local_918.field_2._M_local_buf[0] = '\0';
                local_630._0_8_ = local_8b0;
                local_630._8_8_ = local_8b8;
                local_620._0_8_ = 7;
                local_620._8_8_ = "/*.LCOV";
                views._M_len = 2;
                views._M_array = (iterator)local_630;
                cmCatViews_abi_cxx11_(&local_838,views);
                std::__cxx11::string::operator=((string *)&local_918,(string *)&local_838);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_838._M_dataplus._M_p != &local_838.field_2) {
                  operator_delete(local_838._M_dataplus._M_p,
                                  local_838.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_630,"   looking for LCOV files in: ",0x1e);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_630,local_918._M_dataplus._M_p,
                                     local_918._M_string_length);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5c3,local_838._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_838._M_dataplus._M_p != &local_838.field_2) {
                  operator_delete(local_838._M_dataplus._M_p,
                                  local_838.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
                std::ios_base::~ios_base(local_5c0);
                cmsys::Glob::FindFiles(&local_158,&local_918,(GlobMessages *)0x0);
                pvVar15 = cmsys::Glob::GetFiles_abi_cxx11_(&local_158);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_8d8,
                           local_8d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (pvVar15->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (pvVar15->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
                local_a20 = 0;
                local_3a8 = local_8d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                bVar5 = local_8d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                        local_8d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
                pbVar14 = local_8d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                while (!bVar5) {
                  std::__cxx11::string::_M_assign((string *)&local_a00);
                  std::ifstream::ifstream(local_630,local_a00,_S_in);
                  if ((abStack_610[*(long *)(local_630._0_8_ + -0x18)] & 5) != 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_838);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_838,"Cannot open file: ",0x12);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_838,local_a00,local_9f8);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5cd,(char *)local_368._0_8_,false);
                    if ((_func_int **)local_368._0_8_ != local_358) {
                      operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_838);
                    std::ios_base::~ios_base(local_7c8);
                  }
                  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
                  local_938._M_string_length = 0;
                  local_938.field_2._M_local_buf[0] = '\0';
                  bVar6 = cmsys::SystemTools::GetLineFromStream
                                    ((istream *)local_630,&local_938,(bool *)0x0,0xffffffffffffffff)
                  ;
                  if (bVar6) {
                    std::__cxx11::string::substr((ulong)&local_838,(ulong)&local_938);
                    std::__cxx11::string::operator=((string *)&local_938,(string *)&local_838);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_838._M_dataplus._M_p != &local_838.field_2) {
                      operator_delete(local_838._M_dataplus._M_p,
                                      local_838.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::string::_M_assign((string *)&local_898);
                    std::__cxx11::string::_M_assign((string *)&local_980);
                    pbVar4 = local_8d8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    for (pbVar18 = local_8d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar4;
                        pbVar18 = pbVar18 + 1) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_838);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_838,"Found LCOV File: ",0x11);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_838,(pbVar18->_M_dataplus)._M_p,
                                           pbVar18->_M_string_length);
                      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                      std::ostream::put((char)poVar11);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5e2,(char *)local_368._0_8_,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_838);
                      std::ios_base::~ios_base(local_7c8);
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_838);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_838,"SourceFile: ",0xc);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_838,local_898,local_890);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5e6,(char *)local_368._0_8_,
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if ((_func_int **)local_368._0_8_ != local_358) {
                      operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_838);
                    std::ios_base::~ios_base(local_7c8);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_838);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_838,"lCovFile: ",10);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_838,local_a00,local_9f8);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5e8,(char *)local_368._0_8_,
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if ((_func_int **)local_368._0_8_ != local_358) {
                      operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_838);
                    std::ios_base::~ios_base(local_7c8);
                    if ((local_9f8 != 0) && (local_980._M_string_length != 0)) {
                      this_00 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                ::operator[](local_3b0,&local_980);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_838);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_838,"   in lcovFile: ",0x10);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_838,local_a00,local_9f8);
                      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                      std::ostream::put((char)poVar11);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5f1,(char *)local_368._0_8_,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_838);
                      std::ios_base::~ios_base(local_7c8);
                      std::ifstream::ifstream(&local_838,local_a00,_S_in);
                      if ((abStack_818[*(long *)(local_838._M_dataplus._M_p + -0x18)] & 5) == 0) {
                        local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
                        local_9e0._M_string_length = 0;
                        local_9e0.field_2._M_local_buf[0] = '\0';
                        cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&local_838,&local_9e0,(bool *)0x0,0xffffffffffffffff);
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_368,"File is ready, start reading.",0x1d);
                        std::ios::widen((char)*(_func_int **)(local_368._0_8_ + -0x18) +
                                        (char)local_368);
                        std::ostream::put((char)local_368);
                        std::ostream::flush();
                        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar2,5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5fe,(char *)local_9c0[0],
                                     (this->super_cmCTestGenericHandler).Quiet);
                        if (local_9c0[0] != local_9b0) {
                          operator_delete(local_9c0[0],local_9b0[0] + 1);
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
                        std::ios_base::~ios_base(local_2f8);
                        while (bVar7 = cmsys::SystemTools::GetLineFromStream
                                                 ((istream *)&local_838,&local_9e0,(bool *)0x0,
                                                  0xffffffffffffffff), bVar7) {
                          if (0xb < local_9e0._M_string_length) {
                            std::__cxx11::string::substr((ulong)local_368,(ulong)&local_9e0);
                            iVar8 = atoi((char *)local_368._0_8_);
                            std::__cxx11::string::substr((ulong)local_9c0,(ulong)&local_9e0);
                            iVar9 = atoi((char *)local_9c0[0]);
                            if (0 < iVar9) {
                              uVar17 = (ulong)(iVar9 + -1);
                              while( true ) {
                                piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start;
                                __position._M_current =
                                     (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish;
                                if (uVar17 < (ulong)((long)__position._M_current - (long)piVar3 >> 2
                                                    )) break;
                                local_95c = -1;
                                if (__position._M_current ==
                                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                            (this_00,__position,&local_95c);
                                }
                                else {
                                  *__position._M_current = -1;
                                  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                                }
                              }
                              if ((piVar3[uVar17] < 0) &&
                                 ((0 < iVar8 ||
                                  (lVar16 = std::__cxx11::string::find((char)local_368,0x23),
                                  lVar16 != -1)))) {
                                (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start[uVar17] = 0;
                              }
                              piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start + uVar17;
                              *piVar1 = *piVar1 + iVar8;
                            }
                            if (local_9c0[0] != local_9b0) {
                              operator_delete(local_9c0[0],local_9b0[0] + 1);
                            }
                            if ((_func_int **)local_368._0_8_ != local_358) {
                              operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                            }
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
                          operator_delete(local_9e0._M_dataplus._M_p,
                                          CONCAT71(local_9e0.field_2._M_allocated_capacity._1_7_,
                                                   local_9e0.field_2._M_local_buf[0]) + 1);
                        }
                      }
                      else {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_368,"Cannot open file: ",0x12);
                        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_368,local_a00,local_9f8);
                        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                        std::ostream::put((char)poVar11);
                        std::ostream::flush();
                        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar2,7,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5f6,local_9e0._M_dataplus._M_p,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
                          operator_delete(local_9e0._M_dataplus._M_p,
                                          CONCAT71(local_9e0.field_2._M_allocated_capacity._1_7_,
                                                   local_9e0.field_2._M_local_buf[0]) + 1);
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
                        std::ios_base::~ios_base(local_2f8);
                      }
                      local_980._M_string_length = 0;
                      *local_980._M_dataplus._M_p = '\0';
                      std::ifstream::~ifstream(&local_838);
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_838);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_838,"Error while parsing lcov file \'",0x1f);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_838,local_a00,local_9f8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\':",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11," No source file name found!",0x1b);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5d6,(char *)local_368._0_8_,false);
                    if ((_func_int **)local_368._0_8_ != local_358) {
                      operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_838);
                    std::ios_base::~ios_base(local_7c8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_938._M_dataplus._M_p != &local_938.field_2) {
                    operator_delete(local_938._M_dataplus._M_p,
                                    CONCAT71(local_938.field_2._M_allocated_capacity._1_7_,
                                             local_938.field_2._M_local_buf[0]) + 1);
                  }
                  std::ifstream::~ifstream(local_630);
                  if (!bVar6) {
                    local_a20 = 1;
                    break;
                  }
                  pbVar14 = pbVar14 + 1;
                  bVar5 = pbVar14 == local_3a8;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_918._M_dataplus._M_p != &local_918.field_2) {
                  operator_delete(local_918._M_dataplus._M_p,
                                  CONCAT71(local_918.field_2._M_allocated_capacity._1_7_,
                                           local_918.field_2._M_local_buf[0]) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_8d8);
                if (local_8b8 != &local_8a8) {
                  operator_delete(local_8b8,CONCAT71(uStack_8a7,local_8a8) + 1);
                }
                cmsys::Glob::~Glob(&local_158);
                if (local_a00 != &local_9f0) {
                  operator_delete(local_a00,CONCAT71(uStack_9ef,local_9f0) + 1);
                }
                if (local_898 != &local_888) {
                  operator_delete(local_898,CONCAT71(uStack_887,local_888) + 1);
                }
                if (!bVar5) goto LAB_001b0b66;
                pbVar14 = local_3b8 + 1;
              } while (pbVar14 != local_3c0);
            }
            local_a20 = 0x24;
LAB_001b0b66:
            if (local_a20 == 0x24) {
              iVar8 = local_a1c * -0x3d70a3d7;
              local_a1c = local_a1c + 1;
              uVar10 = iVar8 + 0xc7ae1479;
              local_a20 = 0;
              if ((uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f) < 0x51eb851) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_630," processed: ",0xc);
                poVar11 = (ostream *)std::ostream::operator<<(local_630,local_a1c);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," out of ",8);
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x631,local_838._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_838._M_dataplus._M_p != &local_838.field_2) {
                  operator_delete(local_838._M_dataplus._M_p,
                                  local_838.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
                std::ios_base::~ios_base(local_5c0);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"    ",4);
                pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x632,local_838._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_838._M_dataplus._M_p != &local_838.field_2) {
                  operator_delete(local_838._M_dataplus._M_p,
                                  local_838.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
                std::ios_base::~ios_base(local_5c0);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_428);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_630,"Problem running coverage on file: ",0x22);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_630,(local_a08->_M_dataplus)._M_p,
                                 local_a08->_M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x596,local_838._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_838._M_dataplus._M_p != &local_838.field_2) {
              operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
            std::ios_base::~ios_base(local_5c0);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_630,"Command produced error: ",0x18);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_630,local_958._M_dataplus._M_p,
                                 local_958._M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x598,local_838._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_838._M_dataplus._M_p != &local_838.field_2) {
              operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
            std::ios_base::~ios_base(local_5c0);
            cont->Error = cont->Error + 1;
            local_a20 = 0x11;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_dataplus._M_p != &local_958.field_2) {
            operator_delete(local_958._M_dataplus._M_p,
                            CONCAT71(local_958.field_2._M_allocated_capacity._1_7_,
                                     local_958.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
            operator_delete(local_9a0._M_dataplus._M_p,
                            CONCAT71(local_9a0.field_2._M_allocated_capacity._1_7_,
                                     local_9a0.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_630,"Unable to change working directory to ",0x26);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_630,local_8f8._M_dataplus._M_p,
                               local_8f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," : ",3);
          __s = strerror(local_1d0.ResultCode);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
          }
          else {
            sVar12 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,__s,sVar12);
          }
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x57e,local_838._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_838._M_dataplus._M_p != &local_838.field_2) {
            operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
          std::ios_base::~ios_base(local_5c0);
          cont->Error = cont->Error + 1;
          local_a20 = 0x11;
        }
        cmWorkingDirectory::~cmWorkingDirectory(&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
          operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
        }
        if ((local_a20 != 0x11) && (local_a20 != 0)) goto LAB_001b10b3;
        local_a08 = local_a08 + 1;
      } while (local_a08 != local_3c8);
      local_a20 = 0x10;
LAB_001b10b3:
      iVar8 = 0;
      if (local_a20 == 0x10) {
        iVar8 = local_a1c;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3a0);
    cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_980._M_dataplus._M_p != &local_980.field_2) {
      operator_delete(local_980._M_dataplus._M_p,
                      CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                               local_980.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_630,"Error while finding LCov files.\n",0x20);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x553,local_838._M_dataplus._M_p,false);
LAB_001b11c3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
    std::ios_base::~ios_base(local_5c0);
    iVar8 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_878);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if (local_858[0] != local_848) {
    operator_delete(local_858[0],local_848[0] + 1);
  }
LAB_001b12e4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  std::vector<std::string> covargs =
    cmSystemTools::ParseArguments(lcovExtraFlags);
  covargs.insert(covargs.begin(), lcovCommand);
  const std::string command = joinCommandLine(covargs);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (std::string const& f : files) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(f);
    cmWorkingDirectory workdir(fileDir);
    if (workdir.Failed()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to change working directory to "
                   << fileDir << " : "
                   << std::strerror(workdir.GetLastResult()) << std::endl);
      cont->Error++;
      continue;
    }

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(covargs, &output, &errors, &retVal,
                                      fileDir.c_str(),
                                      cmDuration::zero() /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Coverage command returned: "
                   << retVal << " while processing: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    cmsys::SystemTools::Split(output, lines);

    for (std::string const& line : lines) {
      std::string sourceFile;
      std::string lcovFile;

      if (line.empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = cmStrCat(dir, "/*.LCOV");
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      cm::append(lcovFiles, gl.GetFiles());

      for (std::string const& file : lcovFiles) {
        lcovFile = file;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::string const& t : lcovFiles) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile.clear();
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}